

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

quatd * tinyusdz::to_quaternion(quatd *__return_storage_ptr__,double3 *axis,double angle)

{
  double dVar1;
  const_reference pvVar2;
  reference pvVar3;
  double dVar4;
  double dVar5;
  double c;
  double s;
  double angle_local;
  double3 *axis_local;
  
  dVar4 = math::sin_pi((angle / 2.0) / 180.0);
  dVar5 = math::cos_pi((angle / 2.0) / 180.0);
  pvVar2 = ::std::array<double,_3UL>::operator[](axis,0);
  dVar1 = *pvVar2;
  pvVar3 = ::std::array<double,_3UL>::operator[](&__return_storage_ptr__->imag,0);
  *pvVar3 = dVar1 * dVar4;
  pvVar2 = ::std::array<double,_3UL>::operator[](axis,1);
  dVar1 = *pvVar2;
  pvVar3 = ::std::array<double,_3UL>::operator[](&__return_storage_ptr__->imag,1);
  *pvVar3 = dVar1 * dVar4;
  pvVar2 = ::std::array<double,_3UL>::operator[](axis,2);
  dVar1 = *pvVar2;
  pvVar3 = ::std::array<double,_3UL>::operator[](&__return_storage_ptr__->imag,2);
  *pvVar3 = dVar1 * dVar4;
  __return_storage_ptr__->real = dVar5;
  return __return_storage_ptr__;
}

Assistant:

value::quatd to_quaternion(const value::double3 &axis, const double angle) {

  // Use sin_pi and cos_pi for better accuracy.
  double s = math::sin_pi(angle/2.0/180.0);
  double c = math::cos_pi(angle/2.0/180.0);

  value::quatd q;
  q.imag[0] = axis[0] * s;
  q.imag[1] = axis[1] * s;
  q.imag[2] = axis[2] * s;
  q.real = c;

  return q;
}